

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-example2.c
# Opt level: O1

void decode(FILE *inputFile,FILE *outputFile)

{
  wchar_t *__ws;
  char *plaintext_out;
  wchar_t *pwVar1;
  size_t sVar2;
  rcnb_decodestate ds;
  rcnb_decodestate local_40;
  
  __ws = (wchar_t *)malloc(0x4b0);
  plaintext_out = (char *)malloc(100);
  rcnb_init_decodestate(&local_40);
  pwVar1 = fgetws(__ws,100,(__FILE *)inputFile);
  if (pwVar1 != (wchar_t *)0x0) {
    do {
      sVar2 = wcslen(__ws);
      sVar2 = rcnb_decode_block(__ws,sVar2,plaintext_out,&local_40);
      fwrite(plaintext_out,1,sVar2,(FILE *)outputFile);
      pwVar1 = fgetws(__ws,100,(__FILE *)inputFile);
    } while (pwVar1 != (wchar_t *)0x0);
  }
  sVar2 = rcnb_decode_blockend(plaintext_out,&local_40);
  fwrite(plaintext_out,1,sVar2,(FILE *)outputFile);
  free(__ws);
  free(plaintext_out);
  return;
}

Assistant:

void decode(FILE* inputFile, FILE* outputFile)
{
    /* set up a destination buffer large enough to hold the decoded data */
    int size = SIZE;
    wchar_t* encoded = (wchar_t*)malloc(3 * size * sizeof(wchar_t));
    char* decoded = (char*)malloc(size); /* ~1/2 x encoded */
    /* we need an encoder and decoder state */
    rcnb_decodestate ds;
    /* store the number of bytes encoded by a single call */
    size_t cnt = 0;

    /*---------- START DECODING ----------*/
    /* initialise the encoder state */
    rcnb_init_decodestate(&ds);
    /* gather data from the input and send it to the output */
    while (fgetws(encoded, size, inputFile))
    {
        cnt = rcnb_decode_block(encoded, wcslen(encoded), decoded, &ds);
        /* output the encoded bytes to the output file */
        fwrite(decoded, sizeof(char), cnt, outputFile);
    }
    /* since we have reached the end of the input file, we know that
       there is no more input data; finalise the decoding */
    cnt = rcnb_decode_blockend(decoded, &ds);
    /* write the last bytes to the output file */
    fwrite(decoded, sizeof(char), cnt, outputFile);
    /*---------- STOP DECODING  ----------*/

    free(encoded);
    free(decoded);
}